

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O0

qsizetype QtPrivate::findByteArray(QByteArrayView haystack,qsizetype from,QByteArrayView needle)

{
  QByteArrayView haystack_00;
  const_pointer pvVar1;
  storage_type *haystack0_00;
  qsizetype l_00;
  storage_type *in_RDX;
  long in_FS_OFFSET;
  qsizetype sl;
  qsizetype l;
  const_pointer haystack0;
  qsizetype in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  qsizetype in_stack_ffffffffffffff68;
  qsizetype in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  qsizetype in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  qsizetype in_stack_ffffffffffffff98;
  storage_type *local_40;
  QByteArrayView local_28;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar1 = QByteArrayView::data(&local_18);
  haystack0_00 = (storage_type *)QByteArrayView::size(&local_18);
  l_00 = QByteArrayView::size(&local_28);
  if (l_00 == 1) {
    QByteArrayView::front(&local_28);
    haystack_00.m_data = in_RDX;
    haystack_00.m_size = (qsizetype)pvVar1;
    local_40 = (storage_type *)
               findByteArray(haystack_00,(qsizetype)in_stack_ffffffffffffff90,
                             (char)((ulong)in_stack_ffffffffffffff88 >> 0x38));
  }
  else {
    if ((long)in_RDX < 0) {
      in_RDX = haystack0_00 + (long)in_RDX;
    }
    if (haystack0_00 < in_RDX + l_00) {
      local_40 = (storage_type *)0xffffffffffffffff;
    }
    else {
      local_40 = in_RDX;
      if (l_00 != 0) {
        if (haystack0_00 == (storage_type *)0x0) {
          local_40 = (storage_type *)0xffffffffffffffff;
        }
        else if (((long)haystack0_00 < 0x1f5) || (l_00 < 6)) {
          QByteArrayView::data(&local_28);
          local_40 = (storage_type *)
                     qFindByteArray(haystack0_00,l_00,in_stack_ffffffffffffff98,
                                    in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        }
        else {
          QByteArrayView::data(&local_28);
          local_40 = (storage_type *)
                     qFindByteArrayBoyerMoore
                               (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                in_stack_ffffffffffffff58);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (qsizetype)local_40;
}

Assistant:

qsizetype QtPrivate::findByteArray(QByteArrayView haystack, qsizetype from, QByteArrayView needle) noexcept
{
    const auto haystack0 = haystack.data();
    const auto l = haystack.size();
    const auto sl = needle.size();
#if !QT_CONFIG(memmem)
    if (sl == 1)
        return findByteArray(haystack, from, needle.front());
#endif

    if (from < 0)
        from += l;
    if (std::size_t(sl + from) > std::size_t(l))
        return -1;
    if (!sl)
        return from;
    if (!l)
        return -1;

#if QT_CONFIG(memmem)
    auto where = memmem(haystack0 + from, l - from, needle.data(), sl);
    return where ? static_cast<const char *>(where) - haystack0 : -1;
#endif

    /*
      We use the Boyer-Moore algorithm in cases where the overhead
      for the skip table should pay off, otherwise we use a simple
      hash function.
    */
    if (l > 500 && sl > 5)
        return qFindByteArrayBoyerMoore(haystack0, l, from, needle.data(), sl);
    return qFindByteArray(haystack0, l, from, needle.data(), sl);
}